

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

void decode_alcCaptureSamples(void)

{
  uint8 *buffer;
  uint8 *blob;
  uint64 bloblen;
  void *pvStack_240;
  ALCsizei samples;
  void *origbuffer;
  ALCdevice *device;
  CallerInfo callerinfo;
  
  IO_ENTRYINFO((CallerInfo *)&device);
  if (io_failure == 0) {
    origbuffer = IO_PTR();
    pvStack_240 = IO_PTR();
    bloblen._4_4_ = IO_ALCSIZEI();
    buffer = IO_BLOB((uint64 *)&blob);
    if (io_failure == 0) {
      visit_alcCaptureSamples
                ((CallerInfo *)&device,(ALCdevice *)origbuffer,pvStack_240,buffer,(ALCsizei)blob,
                 bloblen._4_4_);
    }
  }
  return;
}

Assistant:

static void decode_alcCaptureSamples(void)
{
    IO_START(alcCaptureSamples);
    ALCdevice *device = (ALCdevice *) IO_PTR();
    void *origbuffer = IO_PTR();
    const ALCsizei samples = IO_ALCSIZEI();
    uint64 bloblen;
    uint8 *blob = IO_BLOB(&bloblen);
    if (!io_failure) visit_alcCaptureSamples(&callerinfo, device, origbuffer, blob, bloblen, samples);
    IO_END();
}